

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WriteValue<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>
          (Serializer *this,vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true> *vec)

{
  pointer psVar1;
  shared_ptr<duckdb::ColumnStatistics,_true> *item;
  pointer psVar2;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                        ).
                        super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                        ).
                        super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar1 = (vec->
           super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           ).
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (vec->
                super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                ).
                super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    WriteValue<duckdb::ColumnStatistics>
              (this,(psVar2->internal).
                    super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}